

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

void plan(int count)

{
  long lVar1;
  int iVar2;
  
  lVar1 = (long)level;
  iVar2 = level + 1;
  level = iVar2;
  plan_test[lVar1 + 1] = count;
  tests_done[lVar1 + 1] = 0;
  tests_failed[lVar1 + 1] = 0;
  if (iVar2 == 0) {
    puts("TAP version 13");
  }
  _space(_stdout);
  printf("%d..%d\n",1,(ulong)(uint)plan_test[level]);
  return;
}

Assistant:

void
plan(int count)
{
	++level;
	plan_test[level] = count;
	tests_done[level] = 0;
	tests_failed[level] = 0;

	if (level == 0)
		printf("TAP version 13\n");

	_space(stdout);
	printf("%d..%d\n", 1, plan_test[level]);
}